

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O3

bool __thiscall QtMWidgets::ListModel<QImage>::insertRows(ListModel<QImage> *this,int row,int count)

{
  long lVar1;
  ListModelPrivate<QImage> *pLVar2;
  ulong uVar3;
  long i;
  long lVar4;
  QImage local_48 [24];
  
  lVar4 = (long)row;
  lVar1 = (((this->d).d)->data).d.size;
  if (lVar4 <= lVar1) {
    if (0 < count) {
      uVar3 = (ulong)(uint)count;
      i = lVar4;
      do {
        pLVar2 = (this->d).d;
        QImage::QImage(local_48);
        QtPrivate::QMovableArrayOps<QImage>::emplace<QImage>
                  ((QMovableArrayOps<QImage> *)&pLVar2->data,i,local_48);
        QImage::~QImage(local_48);
        i = i + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    AbstractListModel::rowsInserted(&this->super_AbstractListModel,row,row + count + -1);
  }
  return lVar4 <= lVar1;
}

Assistant:

virtual bool insertRows( int row, int count )
	{
		if( row > d->data.count() )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.insert( row + i, T() );

		emit rowsInserted( row, row + count - 1 );

		return true;
	}